

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O1

void __thiscall xLearn::DMatrix::CopyFrom(DMatrix *this,DMatrix *matrix)

{
  uint uVar1;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  uint64 uVar3;
  ostream *poVar4;
  pointer pNVar5;
  ulong uVar6;
  Logger local_6c;
  undefined1 local_68 [32];
  string local_48;
  
  if (matrix != (DMatrix *)0x0) {
    Reset(this);
    uVar3 = matrix->hash_value_2;
    this->hash_value_1 = matrix->hash_value_1;
    this->hash_value_2 = uVar3;
    uVar1 = matrix->row_length;
    this->row_length = uVar1;
    local_68._0_8_ = (value_type)0x0;
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::resize(&this->row,(ulong)uVar1,(value_type *)local_68);
    if (this->row_length != 0) {
      uVar6 = 0;
      do {
        pvVar2 = (matrix->row).
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6];
        for (pNVar5 = (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pNVar5 != *(pointer *)
                       ((long)&(pvVar2->
                               super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                               _M_impl.super__Vector_impl_data + 8); pNVar5 = pNVar5 + 1) {
          AddNode(this,(index_t)uVar6,pNVar5->feat_id,pNVar5->feat_val,pNVar5->field_id);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->row_length);
    }
    std::vector<float,_std::allocator<float>_>::operator=(&this->Y,&matrix->Y);
    std::vector<float,_std::allocator<float>_>::operator=(&this->norm,&matrix->norm);
    this->has_label = matrix->has_label;
    this->pos = matrix->pos;
    return;
  }
  local_6c.severity_ = ERR;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
             ,"");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CopyFrom","");
  poVar4 = Logger::Start(ERR,(string *)local_68,0xe7,&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xe7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"matrix",6);
  std::operator<<(poVar4," == NULL \n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_68);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void CopyFrom(const DMatrix* matrix) {
    CHECK_NOTNULL(matrix);
    this->Reset();
    // Copy hash value
    this->hash_value_1 = matrix->hash_value_1;
    this->hash_value_2 = matrix->hash_value_2;
    // Copy row length
    this->row_length = matrix->row_length;
    this->row.resize(row_length, nullptr);
    // Copy row
    for (index_t i = 0; i < row_length; ++i) {
      SparseRow* rowc = matrix->row[i];
      for (SparseRow::iterator iter = rowc->begin();
           iter != rowc->end(); ++iter) {
        this->AddNode(i, 
                iter->feat_id, 
                iter->feat_val, 
                iter->field_id);
      }
    }
    // Copy y
    this->Y = matrix->Y;
    // Copy norm
    this->norm = matrix->norm;
    // Copy has label
    this->has_label = matrix->has_label;
    // Copy pos
    this->pos = matrix->pos;
  }